

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O2

bool __thiscall
v_hashmap<substring,_features_*>::is_equivalent
          (v_hashmap<substring,_features_*> *this,substring *key,substring *key2)

{
  code *UNRECOVERED_JUMPTABLE;
  undefined1 uVar1;
  
  UNRECOVERED_JUMPTABLE = *(code **)this;
  if (UNRECOVERED_JUMPTABLE == (code *)0x0 && *(code **)(this + 8) == (code *)0x0) {
    return true;
  }
  if (UNRECOVERED_JUMPTABLE != (code *)0x0) {
    uVar1 = (*UNRECOVERED_JUMPTABLE)(*(undefined8 *)(this + 0x48));
    return (bool)uVar1;
  }
  uVar1 = (**(code **)(this + 8))(key,key2);
  return (bool)uVar1;
}

Assistant:

bool is_equivalent(const K& key, const K& key2)
  {
    if ((equivalent == nullptr) && (equivalent_no_data == nullptr))
      return true;
    else if (equivalent != nullptr)
      return equivalent(eq_data, key, key2);
    else
      return equivalent_no_data(key, key2);
  }